

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projection.cpp
# Opt level: O0

void __thiscall
Projection::set_outflow_bcs
          (Projection *this,int which_call,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *phi,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *Vel_in,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *Divu_in,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *Sig_in,int c_lev,int f_lev,
          int have_divu)

{
  undefined8 uVar1;
  bool bVar2;
  Side SVar3;
  int iVar4;
  Geometry *this_00;
  Box *pBVar5;
  IntVect *pIVar6;
  AmrLevel *this_01;
  Long LVar7;
  int *piVar8;
  AmrLevel **ppAVar9;
  Amr *in_RDX;
  int in_ESI;
  IntVect IVar10;
  int in_stack_00000008;
  int in_stack_00000010;
  int lev_2;
  Real gravity;
  int Divu;
  int Divu_Type;
  NavierStokesBase *ns0;
  int lev_1;
  int ii;
  BoxArray uncovered_outflow_ba;
  Box *valid_state_strip;
  BoxArray *Lgrids;
  int dir;
  Box domain;
  int lev;
  int outDir;
  int iface;
  Box temp_state_strip;
  int i;
  int icount [10];
  Box state_strip [10] [6];
  int ccStripWidth;
  int numOutFlowFaces [10];
  int numOutFlowFacesAtAllLevels;
  int fine_level [6];
  Orientation outFacesAtThisLevel [10] [6];
  Orientation outFaces [6];
  bool hasOutFlow;
  IndexType typ;
  int bg;
  uint bitval;
  IntVect hi;
  IntVect low;
  IndexType typ_1;
  int sm;
  IntVect hi_1;
  IntVect low_1;
  int in_stack_fffffffffffff238;
  int in_stack_fffffffffffff23c;
  Amr *in_stack_fffffffffffff240;
  int *in_stack_fffffffffffff248;
  BCRec *in_stack_fffffffffffff250;
  string *in_stack_fffffffffffff258;
  undefined4 in_stack_fffffffffffff260;
  undefined4 in_stack_fffffffffffff264;
  Box *in_stack_fffffffffffff268;
  undefined4 in_stack_fffffffffffff270;
  undefined4 in_stack_fffffffffffff274;
  bool local_d62;
  Print *in_stack_fffffffffffff2b0;
  allocator *paVar11;
  undefined8 local_d48;
  int *local_d28;
  Orientation *local_d10;
  Orientation *local_cf8;
  int local_cd8;
  allocator local_cd1;
  string local_cd0 [39];
  allocator local_ca9;
  string local_ca8 [32];
  double local_c88;
  undefined8 local_c78;
  int local_c70;
  int local_c6c;
  undefined1 local_bfc [28];
  undefined1 *local_be0;
  BoxArray *local_bd8;
  int local_bcc;
  Box local_bc8;
  Box local_bac;
  Box local_b90;
  int local_b74;
  int local_b70;
  int local_b6c;
  Box local_b68;
  int local_b4c;
  int aiStack_b48 [12];
  int local_b18 [378];
  Real in_stack_fffffffffffffad0;
  Orientation *in_stack_fffffffffffffad8;
  Box *in_stack_fffffffffffffae0;
  int in_stack_fffffffffffffaec;
  int in_stack_fffffffffffffaf0;
  int in_stack_fffffffffffffaf4;
  Projection *in_stack_fffffffffffffaf8;
  int aiStack_488 [3];
  undefined4 local_47c;
  int aiStack_478 [11];
  int local_44c;
  int aiStack_448 [8];
  Orientation local_428 [60];
  Orientation local_338 [6];
  Orientation aOStack_320 [2];
  undefined1 local_315;
  int in_stack_fffffffffffffd30;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_fffffffffffffd38;
  MultiFab *in_stack_fffffffffffffd40;
  MultiFab *in_stack_fffffffffffffd48;
  MultiFab *in_stack_fffffffffffffd50;
  int in_stack_fffffffffffffd58;
  uint local_138;
  int local_134;
  int local_130 [3];
  undefined8 local_120;
  int local_118;
  uint local_114;
  IntVect local_110;
  IntVect local_100;
  int local_f0;
  int local_ec;
  Box *local_e8;
  uint local_dc;
  uint local_d8;
  int local_d4;
  IntVect local_d0;
  IntVect local_c4;
  int local_b8;
  int local_b4;
  Box *local_b0;
  int local_a4;
  uint *local_a0;
  int local_98;
  int local_94;
  uint *local_90;
  int local_88;
  int local_84;
  IntVect *local_80;
  int local_74;
  IntVect *local_70;
  int local_64;
  undefined8 *local_60;
  int local_58;
  int local_54;
  IntVect *local_50;
  int local_48;
  int local_44;
  IntVect *local_40;
  int local_38;
  int local_34;
  IntVect *local_30;
  int local_28;
  int local_24;
  IntVect *local_20;
  
  if (verbose != 0) {
    amrex::OutStream();
    amrex::Print::Print((Print *)CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
                        (ostream *)in_stack_fffffffffffff268);
    amrex::Print::operator<<
              ((Print *)in_stack_fffffffffffff240,
               (char (*) [53])CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238));
    local_315 = 10;
    amrex::Print::operator<<
              ((Print *)in_stack_fffffffffffff240,
               (char *)CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238));
    amrex::Print::~Print(in_stack_fffffffffffff2b0);
  }
  local_cf8 = local_338;
  do {
    amrex::Orientation::Orientation(local_cf8);
    local_cf8 = local_cf8 + 1;
  } while (local_cf8 != aOStack_320);
  local_d10 = local_428;
  do {
    amrex::Orientation::Orientation(local_d10);
    local_d10 = local_d10 + 1;
  } while (local_d10 != local_338);
  OutFlowBC::GetOutFlowFaces
            ((bool *)CONCAT44(in_stack_fffffffffffff264,in_stack_fffffffffffff260),
             (Orientation *)in_stack_fffffffffffff258,in_stack_fffffffffffff250,
             in_stack_fffffffffffff248);
  local_47c = 2;
  local_d28 = local_b18;
  do {
    amrex::Box::Box((Box *)in_stack_fffffffffffff240);
    local_d28 = local_d28 + 7;
  } while (local_d28 != aiStack_488);
  for (local_b4c = 0; local_b4c < 10; local_b4c = local_b4c + 1) {
    aiStack_b48[local_b4c] = 0;
  }
  amrex::Box::Box((Box *)in_stack_fffffffffffff240);
  for (local_b6c = 0; local_b6c < local_44c; local_b6c = local_b6c + 1) {
    local_b70 = amrex::Orientation::coordDir(local_338 + local_b6c);
    aiStack_448[local_b6c] = -1;
    for (local_b74 = in_stack_00000010; in_stack_00000008 <= local_b74; local_b74 = local_b74 + -1)
    {
      this_00 = amrex::AmrMesh::Geom((AmrMesh *)in_stack_fffffffffffff240,in_stack_fffffffffffff23c)
      ;
      pBVar5 = amrex::Geometry::Domain(this_00);
      local_b90.smallend.vect._0_8_ = *(undefined8 *)(pBVar5->smallend).vect;
      local_b90._8_8_ = *(undefined8 *)((pBVar5->smallend).vect + 2);
      local_b90.bigend.vect._4_8_ = *(undefined8 *)((pBVar5->bigend).vect + 1);
      local_b90.btype.itype = (pBVar5->btype).itype;
      SVar3 = amrex::Orientation::faceDir(local_338 + local_b6c);
      if (SVar3 == high) {
        local_e8 = &local_b90;
        local_ec = local_b70;
        local_f0 = 2;
        pIVar6 = amrex::Box::smallEnd(local_e8);
        local_100.vect[2] = pIVar6->vect[2];
        local_100.vect._0_8_ = *(undefined8 *)pIVar6->vect;
        pIVar6 = amrex::Box::bigEnd(local_e8);
        local_110.vect[2] = pIVar6->vect[2];
        local_110.vect._0_8_ = *(undefined8 *)pIVar6->vect;
        IVar10 = amrex::Box::type((Box *)in_stack_fffffffffffff258);
        local_130._0_8_ = IVar10.vect._0_8_;
        local_120._0_4_ = local_130[0];
        local_120._4_4_ = local_130[1];
        local_130[2] = IVar10.vect[2];
        local_118 = local_130[2];
        local_64 = local_ec;
        local_114 = *(uint *)((long)&local_120 + (long)local_ec * 4);
        local_74 = local_ec;
        local_134 = (local_110.vect[local_ec] + 1) - (local_114 & 1);
        local_24 = local_ec;
        local_100.vect[local_ec] = local_134;
        iVar4 = local_134 + local_f0 + -1;
        local_34 = local_ec;
        local_110.vect[local_ec] = iVar4;
        local_130 = IVar10.vect;
        local_70 = &local_110;
        local_60 = &local_120;
        local_38 = iVar4;
        local_30 = &local_110;
        local_28 = local_134;
        local_20 = &local_100;
        local_138 = (uint)amrex::Box::ixType(local_e8);
        local_90 = &local_138;
        local_94 = local_ec;
        local_88 = local_ec;
        local_138 = (1 << ((byte)local_ec & 0x1f) ^ 0xffffffffU) & local_138;
        amrex::Box::Box(&local_bac,&local_100,&local_110,(IndexType)local_138);
        local_b68.smallend.vect[0] = local_bac.smallend.vect[0];
        local_b68.smallend.vect[1] = local_bac.smallend.vect[1];
        local_b68.smallend.vect[2] = local_bac.smallend.vect[2];
        local_b68.bigend.vect[0] = local_bac.bigend.vect[0];
        local_b68.bigend.vect[1] = local_bac.bigend.vect[1];
        local_b68.bigend.vect[2] = local_bac.bigend.vect[2];
        local_b68.btype.itype = local_bac.btype.itype;
        amrex::Box::shift(&local_b68,local_b70,-2);
      }
      else {
        local_b0 = &local_b90;
        local_b4 = local_b70;
        local_b8 = 2;
        pIVar6 = amrex::Box::smallEnd(local_b0);
        local_c4.vect._0_8_ = *(undefined8 *)pIVar6->vect;
        local_c4.vect[2] = pIVar6->vect[2];
        pIVar6 = amrex::Box::bigEnd(local_b0);
        uVar1 = *(undefined8 *)pIVar6->vect;
        iVar4 = pIVar6->vect[2];
        local_84 = local_b4;
        local_d4 = local_c4.vect[local_b4];
        local_44 = local_b4;
        local_c4.vect[local_b4] = local_d4 - local_b8;
        local_54 = local_b4;
        local_d0.vect[local_b4] = local_d4 + -1;
        local_d0.vect._0_8_ = uVar1;
        local_d0.vect[2] = iVar4;
        local_80 = &local_c4;
        local_58 = local_d4 + -1;
        local_50 = &local_d0;
        local_48 = local_d4 - local_b8;
        local_40 = &local_c4;
        local_dc = (uint)amrex::Box::ixType(local_b0);
        local_a0 = &local_d8;
        local_a4 = local_b4;
        local_98 = local_b4;
        local_dc = (1 << ((byte)local_b4 & 0x1f) ^ 0xffffffffU) & local_dc;
        local_d8 = local_dc;
        amrex::Box::Box(&local_bc8,&local_c4,&local_d0,(IndexType)local_dc);
        local_b68.smallend.vect[0] = local_bc8.smallend.vect[0];
        local_b68.smallend.vect[1] = local_bc8.smallend.vect[1];
        local_b68.smallend.vect[2] = local_bc8.smallend.vect[2];
        local_b68.bigend.vect[0] = local_bc8.bigend.vect[0];
        local_b68.bigend.vect[1] = local_bc8.bigend.vect[1];
        local_b68.bigend.vect[2] = local_bc8.bigend.vect[2];
        local_b68.btype.itype = local_bc8.btype.itype;
        amrex::Box::shift(&local_b68,local_b70,2);
      }
      for (local_bcc = 0; local_bcc < 3; local_bcc = local_bcc + 1) {
        if (local_bcc != local_b70) {
          amrex::Box::grow(&local_b68,local_bcc,1);
        }
      }
      this_01 = amrex::Amr::getLevel(in_stack_fffffffffffff240,in_stack_fffffffffffff23c);
      local_bd8 = amrex::AmrLevel::boxArray(this_01);
      amrex::Box::operator&
                ((Box *)in_stack_fffffffffffff240,
                 (Box *)CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238));
      local_be0 = local_bfc;
      amrex::complementIn(in_stack_fffffffffffff268,
                          (BoxArray *)CONCAT44(in_stack_fffffffffffff264,in_stack_fffffffffffff260))
      ;
      LVar7 = amrex::BoxArray::size((BoxArray *)0x82ad30);
      if ((LVar7 == 0) && (aiStack_448[local_b6c] == -1)) {
        local_c6c = aiStack_b48[local_b74];
        local_428[(long)local_b74 * 6 + (long)local_c6c].val = local_338[local_b6c].val;
        piVar8 = local_b18 + (long)local_b74 * 0x2a + (long)local_c6c * 7;
        *(undefined8 *)piVar8 = local_b68.smallend.vect._0_8_;
        piVar8[2] = local_b68.smallend.vect[2];
        piVar8[3] = local_b68.bigend.vect[0];
        *(undefined8 *)(piVar8 + 4) = local_b68.bigend.vect._4_8_;
        piVar8[6] = local_b68.btype.itype;
        aiStack_448[local_b6c] = local_b74;
        aiStack_b48[local_b74] = aiStack_b48[local_b74] + 1;
      }
      amrex::BoxArray::~BoxArray((BoxArray *)in_stack_fffffffffffff240);
    }
  }
  for (local_c70 = in_stack_00000010; in_stack_00000008 <= local_c70; local_c70 = local_c70 + -1) {
    aiStack_478[local_c70] = aiStack_b48[local_c70];
  }
  ppAVar9 = amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
                      ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
                       in_stack_fffffffffffff240,
                       CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238));
  if (*ppAVar9 == (AmrLevel *)0x0) {
    local_d48 = 0;
  }
  else {
    local_d48 = __dynamic_cast(*ppAVar9,&amrex::AmrLevel::typeinfo,&NavierStokesBase::typeinfo,0);
  }
  local_c78 = local_d48;
  local_c88 = 0.0;
  if ((in_ESI == 0x3ec) || (in_ESI == 0x3ea)) {
    amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
              ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
               in_stack_fffffffffffff240,
               CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238));
    paVar11 = &local_ca9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_ca8,"divu",paVar11);
    bVar2 = amrex::AmrLevel::isStateVariable
                      (in_stack_fffffffffffff258,in_stack_fffffffffffff250->bc,
                       in_stack_fffffffffffff248);
    std::__cxx11::string::~string(local_ca8);
    std::allocator<char>::~allocator((allocator<char> *)&local_ca9);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      amrex::Error_host((char *)in_stack_fffffffffffff250);
    }
  }
  if ((in_ESI == 0x3eb) || (in_ESI == 0x3e9)) {
    local_c88 = NavierStokesBase::getGravity();
    amrex::Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::operator[]
              ((Vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_> *)
               in_stack_fffffffffffff240,
               CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238));
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_cd0,"divu",&local_cd1);
    bVar2 = amrex::AmrLevel::isStateVariable
                      (in_stack_fffffffffffff258,in_stack_fffffffffffff250->bc,
                       in_stack_fffffffffffff248);
    local_d62 = !bVar2 && local_c88 == 0.0;
    std::__cxx11::string::~string(local_cd0);
    std::allocator<char>::~allocator((allocator<char> *)&local_cd1);
    if (local_d62) {
      amrex::Error_host((char *)in_stack_fffffffffffff250);
    }
  }
  for (local_cd8 = in_stack_00000008; local_cd8 <= in_stack_00000010; local_cd8 = local_cd8 + 1) {
    iVar4 = in_stack_fffffffffffff238;
    if (0 < aiStack_478[local_cd8]) {
      iVar4 = aiStack_478[local_cd8];
      amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                 in_stack_fffffffffffff240,
                 CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238));
      amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                 in_stack_fffffffffffff240,
                 CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238));
      amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                 in_stack_fffffffffffff240,
                 CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238));
      in_stack_fffffffffffff240 = in_RDX;
      set_outflow_bcs_at_level
                (in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0,
                 in_stack_fffffffffffffaec,in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,
                 in_stack_fffffffffffffd30,in_stack_fffffffffffffd38,in_stack_fffffffffffffd40,
                 in_stack_fffffffffffffd48,in_stack_fffffffffffffd50,in_stack_fffffffffffffd58,
                 in_stack_fffffffffffffad0);
    }
    in_stack_fffffffffffff238 = iVar4;
  }
  return;
}

Assistant:

void
Projection::set_outflow_bcs (int        which_call,
                             const Vector<MultiFab*>& phi,
                             const Vector<MultiFab*>& Vel_in,
                             const Vector<MultiFab*>& Divu_in,
                             const Vector<MultiFab*>& Sig_in,
                             int        c_lev,
                             int        f_lev,
                             int        have_divu)
{
    AMREX_ASSERT((which_call == INITIAL_VEL  ) ||
                 (which_call == INITIAL_PRESS) ||
                 (which_call == INITIAL_SYNC ) ||
                 (which_call == LEVEL_PROJ   ) );

    if (which_call != LEVEL_PROJ)
        AMREX_ASSERT(c_lev == 0);

    if (verbose)
      amrex::Print() << "...setting outflow bcs for the nodal projection ... " << '\n';

    bool        hasOutFlow;
    Orientation outFaces[2*AMREX_SPACEDIM];
    Orientation outFacesAtThisLevel[maxlev][2*AMREX_SPACEDIM];

    int fine_level[2*AMREX_SPACEDIM];

    int numOutFlowFacesAtAllLevels;
    int numOutFlowFaces[maxlev];
    OutFlowBC::GetOutFlowFaces(hasOutFlow,outFaces,phys_bc,numOutFlowFacesAtAllLevels);

    //
    // Get 2-wide cc box, state_strip, along interior of top.
    // Get 1-wide nc box, phi_strip  , along top.
    //
    const int ccStripWidth = 2;

//    const int nCompPhi    = 1;
//    const int srcCompVel  = Xvel;
//    const int srcCompDivu = 0;
//    const int   nCompVel  = AMREX_SPACEDIM;
//    const int   nCompDivu = 1;

    //
    // Determine the finest level such that the entire outflow face is covered
    // by boxes at this level (skip if doesnt touch, and bomb if only partially
    // covered).
    //
    Box state_strip[maxlev][2*AMREX_SPACEDIM];

    int icount[maxlev];
    for (int i=0; i < maxlev; i++) icount[i] = 0;

    //
    // This loop is only to define the number of outflow faces at each level.
    //
    Box temp_state_strip;
    for (int iface = 0; iface < numOutFlowFacesAtAllLevels; iface++)
    {
      const int outDir    = outFaces[iface].coordDir();

      fine_level[iface] = -1;
      for (int lev = f_lev; lev >= c_lev; lev--)
      {
        Box domain = parent->Geom(lev).Domain();

        if (outFaces[iface].faceDir() == Orientation::high)
        {
            temp_state_strip = amrex::adjCellHi(domain,outDir,ccStripWidth);
            temp_state_strip.shift(outDir,-ccStripWidth);
        }
        else
        {
            temp_state_strip = amrex::adjCellLo(domain,outDir,ccStripWidth);
            temp_state_strip.shift(outDir,ccStripWidth);
        }
        // Grow the box by one tangentially in order to get velocity bc's.
        for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
          if (dir != outDir) temp_state_strip.grow(dir,1);

        const BoxArray& Lgrids               = parent->getLevel(lev).boxArray();
        const Box&      valid_state_strip    = temp_state_strip & domain;
        const BoxArray  uncovered_outflow_ba = amrex::complementIn(valid_state_strip,Lgrids);

        AMREX_ASSERT( !(uncovered_outflow_ba.size() &&
                     amrex::intersect(Lgrids,valid_state_strip).size()) );

        if ( !(uncovered_outflow_ba.size()) && fine_level[iface] == -1) {
            int ii = icount[lev];
            outFacesAtThisLevel[lev][ii] = outFaces[iface];
            state_strip[lev][ii] = temp_state_strip;
            fine_level[iface] = lev;
            icount[lev]++;
        }
      }
    }

    for (int lev = f_lev; lev >= c_lev; lev--) {
      numOutFlowFaces[lev] = icount[lev];
    }

    NavierStokesBase* ns0 = dynamic_cast<NavierStokesBase*>(LevelData[c_lev]);
    AMREX_ASSERT(!(ns0 == 0));

    int Divu_Type, Divu;
    Real gravity = 0;

    if (which_call == INITIAL_SYNC || which_call == INITIAL_VEL)
    {
      if (!LevelData[c_lev]->isStateVariable("divu", Divu_Type, Divu))
        amrex::Error("Projection::set_outflow_bcs: No divu.");
    }

    if (which_call == INITIAL_PRESS || which_call == LEVEL_PROJ)
    {
      gravity = ns0->getGravity();
      if (!LevelData[c_lev]->isStateVariable("divu", Divu_Type, Divu) &&
          (gravity == 0) )
        amrex::Error("Projection::set_outflow_bcs: No divu or gravity.");
    }

    for (int lev = c_lev; lev <= f_lev; lev++)
    {
      if (numOutFlowFaces[lev] > 0)
        set_outflow_bcs_at_level (which_call,lev,c_lev,
                                  state_strip[lev],
                                  outFacesAtThisLevel[lev],
                                  numOutFlowFaces[lev],
                                  phi,
                                  Vel_in[lev],
                                  Divu_in[lev],
                                  Sig_in[lev],
                                  have_divu,
                                  gravity);

    }

}